

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_snode_merge(lyxp_set *set1,lyxp_set *set2)

{
  lyxp_set_node *plVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  hash_table *phVar5;
  undefined8 uVar6;
  lyxp_node_type lVar7;
  lyxp_set_type lVar8;
  undefined4 uVar9;
  uint uVar10;
  lyxp_set_node *plVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  
  if ((set1->type & ~LYXP_SET_SNODE_SET) != LYXP_SET_EMPTY) {
LAB_00178c37:
    __assert_fail("((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY)) && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x3e9,"void set_snode_merge(struct lyxp_set *, struct lyxp_set *)");
  }
  if (set2->type != LYXP_SET_EMPTY) {
    if (set2->type != LYXP_SET_SNODE_SET) goto LAB_00178c37;
    if (set1->type == LYXP_SET_EMPTY) {
      lVar8 = set2->type;
      uVar9 = *(undefined4 *)&set2->field_0x4;
      uVar3 = *(undefined8 *)&set2->field_0x8;
      plVar11 = (set2->val).nodes;
      uVar4 = *(undefined8 *)((long)&set2->val + 8);
      uVar14 = set2->used;
      uVar13 = set2->size;
      phVar5 = set2->ht;
      uVar2 = set2->ctx_size;
      uVar6 = *(undefined8 *)&set2->field_0x38;
      set1->ctx_pos = set2->ctx_pos;
      set1->ctx_size = uVar2;
      *(undefined8 *)&set1->field_0x38 = uVar6;
      set1->used = uVar14;
      set1->size = uVar13;
      set1->ht = phVar5;
      (set1->val).nodes = plVar11;
      *(undefined8 *)((long)&set1->val + 8) = uVar4;
      set1->type = lVar8;
      *(undefined4 *)&set1->field_0x4 = uVar9;
      *(undefined8 *)&set1->field_0x8 = uVar3;
    }
    else {
      uVar10 = set2->used + set1->used;
      if (set1->size < uVar10) {
        set1->size = uVar10;
        plVar11 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar10 << 4);
        (set1->val).nodes = plVar11;
        if (plVar11 == (lyxp_set_node *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_snode_merge"
                );
          return;
        }
      }
      if (set2->used != 0) {
        uVar2 = set1->used;
        uVar12 = 0;
        do {
          uVar14 = 0;
          if (uVar2 != 0) {
            plVar11 = (set1->val).nodes;
            uVar13 = 0;
            do {
              uVar14 = uVar13;
              if (plVar11->node == (set2->val).nodes[uVar12].node) break;
              uVar13 = uVar13 + 1;
              plVar11 = plVar11 + 1;
              uVar14 = uVar2;
            } while (uVar2 != uVar13);
          }
          if (uVar14 == uVar2) {
            plVar11 = (set2->val).nodes + uVar12;
            lVar7 = plVar11->type;
            uVar14 = plVar11->pos;
            plVar1 = (set1->val).nodes + set1->used;
            plVar1->node = plVar11->node;
            plVar1->type = lVar7;
            plVar1->pos = uVar14;
            set1->used = set1->used + 1;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < set2->used);
      }
      free((set2->val).nodes);
      set2->ctx_pos = 0;
      set2->ctx_size = 0;
      *(undefined8 *)&set2->field_0x38 = 0;
      set2->used = 0;
      set2->size = 0;
      set2->ht = (hash_table *)0x0;
      (set2->val).nodes = (lyxp_set_node *)0x0;
      *(undefined8 *)((long)&set2->val + 8) = 0;
      *(undefined8 *)set2 = 0;
      *(undefined8 *)&set2->field_0x8 = 0;
    }
  }
  return;
}

Assistant:

static void
set_snode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert(((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY))
        && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY)));

    if (set2->type == LYXP_SET_EMPTY) {
        return;
    }

    if (set1->type == LYXP_SET_EMPTY) {
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.snodes = ly_realloc(set1->val.snodes, set1->size * sizeof *set1->val.snodes);
        LY_CHECK_ERR_RETURN(!set1->val.snodes, LOGMEM(NULL), );
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.snodes[j].snode == set2->val.snodes[i].snode) {
                break;
            }
        }

        if (j == orig_used) {
            memcpy(&set1->val.snodes[set1->used], &set2->val.snodes[i], sizeof *set2->val.snodes);
            ++set1->used;
        }
    }

    free(set2->val.snodes);
    memset(set2, 0, sizeof *set2);
}